

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeblock.cpp
# Opt level: O2

CodeBlock * __thiscall cppgenerate::CodeBlock::operator<<(CodeBlock *this,CodeBlock *other)

{
  string local_30 [32];
  
  std::__cxx11::stringbuf::str();
  std::operator<<((ostream *)this,local_30);
  std::__cxx11::string::~string(local_30);
  return this;
}

Assistant:

CodeBlock& CodeBlock::operator<<( const CodeBlock& other ){
    m_text << other.m_text.str();

    return *this;
}